

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

bool argparse::Argument::is_float(string *aValue)

{
  uint *puVar1;
  uint uVar2;
  float tFloat;
  istringstream tStream;
  long local_188 [3];
  uint auStack_170 [24];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_188,(string *)aValue,_S_in);
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  std::istream::_M_extract<float>((float *)local_188);
  uVar2 = *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18) + 8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_188);
  std::ios_base::~ios_base(local_110);
  return (uVar2 & 7) == 2;
}

Assistant:

static bool is_float(const std::string &aValue) {
    std::istringstream tStream(aValue);
    float tFloat;
    // noskipws considers leading whitespace invalid
    tStream >> std::noskipws >> tFloat;
    // Check the entire string was consumed
    // and if either failbit or badbit is set
    return tStream.eof() && !tStream.fail();
  }